

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellANCF_3423.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementShellANCF_3423::ComputeInternalJacobians
          (ChElementShellANCF_3423 *this,double Kfactor,double Rfactor)

{
  ulong uVar1;
  pointer pdVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  long lVar26;
  ulong uVar27;
  undefined1 auVar28 [64];
  ShellANCF_Jacobian formula;
  ChMatrixNM<double,_5,_24> GDEPSP;
  ChMatrixNM<double,_5,_5> KalphaEAS_inv;
  ChVectorN<double,_696> result;
  type tmp;
  ChMatrixNM<double,_24,_24> KTE;
  Scalar local_3f78;
  ChIntegrable3D<Eigen::Matrix<double,_696,_1,_0,_696,_1>_> local_3f70;
  ChElementShellANCF_3423 *local_3f68;
  double local_3f60;
  double local_3f58;
  ulong local_3f50;
  undefined8 *local_3f48;
  Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_24,_5,_0,_24,_5>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_5,_24,_1,_5,_24>_>_>,_Eigen::Matrix<double,_5,_5,_1,_5,_5>,_0>
  local_3f40;
  Matrix<double,_5,_24,_1,_5,_24> *local_3f10;
  Matrix<double,_5,_24,_1,_5,_24> local_3f00;
  Matrix<double,_5,_5,_1,_5,_5> local_3b08;
  Matrix<double,_696,_1,_0,_696,_1> local_3a40;
  Matrix<double,_24,_24,_1,_24,_24> local_2480;
  undefined8 local_1280 [586];
  
  memset(&this->m_JacobianMatrix,0,0x1200);
  if (this->m_numLayers != 0) {
    uVar27 = 0;
    do {
      local_3f70._vptr_ChIntegrable3D = (_func_int **)&PTR__ChIntegrable3D_00b37888;
      local_3f68 = this;
      local_3f60 = Kfactor;
      local_3f58 = Rfactor;
      local_3f50 = uVar27;
      memset(&local_3a40,0,0x15c0);
      pdVar2 = (this->m_GaussZ).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar1 = uVar27 + 1;
      ChQuadrature::Integrate3D<Eigen::Matrix<double,696,1,0,696,1>>
                (&local_3a40,&local_3f70,-1.0,1.0,-1.0,1.0,pdVar2[uVar27],pdVar2[uVar27 + 1],2);
      lVar26 = 0x80;
      do {
        uVar3 = *(undefined8 *)
                 ((long)local_3b08.super_PlainObjectBase<Eigen::Matrix<double,_5,_5,_1,_5,_5>_>.
                        m_storage.m_data.array + lVar26 + 0x50);
        uVar4 = *(undefined8 *)
                 ((long)local_3b08.super_PlainObjectBase<Eigen::Matrix<double,_5,_5,_1,_5,_5>_>.
                        m_storage.m_data.array + lVar26 + 0x58);
        uVar5 = *(undefined8 *)
                 ((long)local_3b08.super_PlainObjectBase<Eigen::Matrix<double,_5,_5,_1,_5,_5>_>.
                        m_storage.m_data.array + lVar26 + 0x60);
        uVar6 = *(undefined8 *)
                 ((long)local_3b08.super_PlainObjectBase<Eigen::Matrix<double,_5,_5,_1,_5,_5>_>.
                        m_storage.m_data.array + lVar26 + 0x68);
        uVar7 = *(undefined8 *)
                 ((long)local_3b08.super_PlainObjectBase<Eigen::Matrix<double,_5,_5,_1,_5,_5>_>.
                        m_storage.m_data.array + lVar26 + 0x70);
        uVar8 = *(undefined8 *)
                 ((long)local_3b08.super_PlainObjectBase<Eigen::Matrix<double,_5,_5,_1,_5,_5>_>.
                        m_storage.m_data.array + lVar26 + 0x78);
        uVar9 = *(undefined8 *)
                 ((long)local_3b08.super_PlainObjectBase<Eigen::Matrix<double,_5,_5,_1,_5,_5>_>.
                        m_storage.m_data.array + lVar26 + 0x80);
        uVar10 = *(undefined8 *)
                  ((long)local_3a40.super_PlainObjectBase<Eigen::Matrix<double,_696,_1,_0,_696,_1>_>
                         .m_storage.m_data.array + lVar26 + -0x40);
        uVar11 = *(undefined8 *)
                  ((long)local_3a40.super_PlainObjectBase<Eigen::Matrix<double,_696,_1,_0,_696,_1>_>
                         .m_storage.m_data.array + lVar26 + -0x38);
        uVar12 = *(undefined8 *)
                  ((long)local_3a40.super_PlainObjectBase<Eigen::Matrix<double,_696,_1,_0,_696,_1>_>
                         .m_storage.m_data.array + lVar26 + -0x30);
        uVar13 = *(undefined8 *)
                  ((long)local_3a40.super_PlainObjectBase<Eigen::Matrix<double,_696,_1,_0,_696,_1>_>
                         .m_storage.m_data.array + lVar26 + -0x28);
        uVar14 = *(undefined8 *)
                  ((long)local_3a40.super_PlainObjectBase<Eigen::Matrix<double,_696,_1,_0,_696,_1>_>
                         .m_storage.m_data.array + lVar26 + -0x20);
        uVar15 = *(undefined8 *)
                  ((long)local_3a40.super_PlainObjectBase<Eigen::Matrix<double,_696,_1,_0,_696,_1>_>
                         .m_storage.m_data.array + lVar26 + -0x18);
        uVar16 = *(undefined8 *)
                  ((long)local_3a40.super_PlainObjectBase<Eigen::Matrix<double,_696,_1,_0,_696,_1>_>
                         .m_storage.m_data.array + lVar26 + -0x10);
        uVar17 = *(undefined8 *)
                  ((long)local_3a40.super_PlainObjectBase<Eigen::Matrix<double,_696,_1,_0,_696,_1>_>
                         .m_storage.m_data.array + lVar26 + -8);
        uVar18 = *(undefined8 *)
                  ((long)local_3a40.super_PlainObjectBase<Eigen::Matrix<double,_696,_1,_0,_696,_1>_>
                         .m_storage.m_data.array + lVar26);
        uVar19 = *(undefined8 *)
                  ((long)local_3a40.super_PlainObjectBase<Eigen::Matrix<double,_696,_1,_0,_696,_1>_>
                         .m_storage.m_data.array + lVar26 + 8);
        uVar20 = *(undefined8 *)
                  ((long)local_3a40.super_PlainObjectBase<Eigen::Matrix<double,_696,_1,_0,_696,_1>_>
                         .m_storage.m_data.array + lVar26 + 0x10);
        uVar21 = *(undefined8 *)
                  ((long)local_3a40.super_PlainObjectBase<Eigen::Matrix<double,_696,_1,_0,_696,_1>_>
                         .m_storage.m_data.array + lVar26 + 0x18);
        uVar22 = *(undefined8 *)
                  ((long)local_3a40.super_PlainObjectBase<Eigen::Matrix<double,_696,_1,_0,_696,_1>_>
                         .m_storage.m_data.array + lVar26 + 0x20);
        uVar23 = *(undefined8 *)
                  ((long)local_3a40.super_PlainObjectBase<Eigen::Matrix<double,_696,_1,_0,_696,_1>_>
                         .m_storage.m_data.array + lVar26 + 0x28);
        uVar24 = *(undefined8 *)
                  ((long)local_3a40.super_PlainObjectBase<Eigen::Matrix<double,_696,_1,_0,_696,_1>_>
                         .m_storage.m_data.array + lVar26 + 0x30);
        uVar25 = *(undefined8 *)
                  ((long)local_3a40.super_PlainObjectBase<Eigen::Matrix<double,_696,_1,_0,_696,_1>_>
                         .m_storage.m_data.array + lVar26 + 0x38);
        *(undefined8 *)((long)local_1280 + lVar26 + -0x80) =
             *(undefined8 *)
              ((long)local_3b08.super_PlainObjectBase<Eigen::Matrix<double,_5,_5,_1,_5,_5>_>.
                     m_storage.m_data.array + lVar26 + 0x48);
        *(undefined8 *)((long)local_1280 + lVar26 + -0x78) = uVar3;
        *(undefined8 *)((long)local_1280 + lVar26 + -0x70) = uVar4;
        *(undefined8 *)((long)local_1280 + lVar26 + -0x68) = uVar5;
        *(undefined8 *)((long)local_1280 + lVar26 + -0x60) = uVar6;
        *(undefined8 *)((long)local_1280 + lVar26 + -0x58) = uVar7;
        *(undefined8 *)((long)local_1280 + lVar26 + -0x50) = uVar8;
        *(undefined8 *)((long)local_1280 + lVar26 + -0x48) = uVar9;
        *(undefined8 *)((long)local_1280 + lVar26 + -0x40) = uVar10;
        *(undefined8 *)((long)local_1280 + lVar26 + -0x38) = uVar11;
        *(undefined8 *)((long)local_1280 + lVar26 + -0x30) = uVar12;
        *(undefined8 *)((long)local_1280 + lVar26 + -0x28) = uVar13;
        *(undefined8 *)((long)local_1280 + lVar26 + -0x20) = uVar14;
        *(undefined8 *)((long)local_1280 + lVar26 + -0x18) = uVar15;
        *(undefined8 *)((long)local_1280 + lVar26 + -0x10) = uVar16;
        *(undefined8 *)((long)local_1280 + lVar26 + -8) = uVar17;
        *(undefined8 *)((long)local_1280 + lVar26) = uVar18;
        *(undefined8 *)((long)local_1280 + lVar26 + 8) = uVar19;
        *(undefined8 *)((long)local_1280 + lVar26 + 0x10) = uVar20;
        *(undefined8 *)((long)local_1280 + lVar26 + 0x18) = uVar21;
        *(undefined8 *)((long)local_1280 + lVar26 + 0x20) = uVar22;
        *(undefined8 *)((long)local_1280 + lVar26 + 0x28) = uVar23;
        *(undefined8 *)((long)local_1280 + lVar26 + 0x30) = uVar24;
        *(undefined8 *)((long)local_1280 + lVar26 + 0x38) = uVar25;
        lVar26 = lVar26 + 0xc0;
      } while (lVar26 != 0x1280);
      local_3f00.super_PlainObjectBase<Eigen::Matrix<double,_5,_24,_1,_5,_24>_>.m_storage.m_data.
      array[0] = local_3a40.super_PlainObjectBase<Eigen::Matrix<double,_696,_1,_0,_696,_1>_>.
                 m_storage.m_data.array[0x240];
      local_3f00.super_PlainObjectBase<Eigen::Matrix<double,_5,_24,_1,_5,_24>_>.m_storage.m_data.
      array[1] = local_3a40.super_PlainObjectBase<Eigen::Matrix<double,_696,_1,_0,_696,_1>_>.
                 m_storage.m_data.array[0x241];
      local_3f00.super_PlainObjectBase<Eigen::Matrix<double,_5,_24,_1,_5,_24>_>.m_storage.m_data.
      array[2] = local_3a40.super_PlainObjectBase<Eigen::Matrix<double,_696,_1,_0,_696,_1>_>.
                 m_storage.m_data.array[0x242];
      local_3f00.super_PlainObjectBase<Eigen::Matrix<double,_5,_24,_1,_5,_24>_>.m_storage.m_data.
      array[3] = local_3a40.super_PlainObjectBase<Eigen::Matrix<double,_696,_1,_0,_696,_1>_>.
                 m_storage.m_data.array[0x243];
      local_3f00.super_PlainObjectBase<Eigen::Matrix<double,_5,_24,_1,_5,_24>_>.m_storage.m_data.
      array[4] = local_3a40.super_PlainObjectBase<Eigen::Matrix<double,_696,_1,_0,_696,_1>_>.
                 m_storage.m_data.array[0x244];
      local_3f00.super_PlainObjectBase<Eigen::Matrix<double,_5,_24,_1,_5,_24>_>.m_storage.m_data.
      array[5] = local_3a40.super_PlainObjectBase<Eigen::Matrix<double,_696,_1,_0,_696,_1>_>.
                 m_storage.m_data.array[0x245];
      local_3f00.super_PlainObjectBase<Eigen::Matrix<double,_5,_24,_1,_5,_24>_>.m_storage.m_data.
      array[6] = local_3a40.super_PlainObjectBase<Eigen::Matrix<double,_696,_1,_0,_696,_1>_>.
                 m_storage.m_data.array[0x246];
      local_3f00.super_PlainObjectBase<Eigen::Matrix<double,_5,_24,_1,_5,_24>_>.m_storage.m_data.
      array[7] = local_3a40.super_PlainObjectBase<Eigen::Matrix<double,_696,_1,_0,_696,_1>_>.
                 m_storage.m_data.array[0x247];
      local_3f00.super_PlainObjectBase<Eigen::Matrix<double,_5,_24,_1,_5,_24>_>.m_storage.m_data.
      array[8] = local_3a40.super_PlainObjectBase<Eigen::Matrix<double,_696,_1,_0,_696,_1>_>.
                 m_storage.m_data.array[0x248];
      local_3f00.super_PlainObjectBase<Eigen::Matrix<double,_5,_24,_1,_5,_24>_>.m_storage.m_data.
      array[9] = local_3a40.super_PlainObjectBase<Eigen::Matrix<double,_696,_1,_0,_696,_1>_>.
                 m_storage.m_data.array[0x249];
      local_3f00.super_PlainObjectBase<Eigen::Matrix<double,_5,_24,_1,_5,_24>_>.m_storage.m_data.
      array[10] = local_3a40.super_PlainObjectBase<Eigen::Matrix<double,_696,_1,_0,_696,_1>_>.
                  m_storage.m_data.array[0x24a];
      local_3f00.super_PlainObjectBase<Eigen::Matrix<double,_5,_24,_1,_5,_24>_>.m_storage.m_data.
      array[0xb] = local_3a40.super_PlainObjectBase<Eigen::Matrix<double,_696,_1,_0,_696,_1>_>.
                   m_storage.m_data.array[0x24b];
      local_3f00.super_PlainObjectBase<Eigen::Matrix<double,_5,_24,_1,_5,_24>_>.m_storage.m_data.
      array[0xc] = local_3a40.super_PlainObjectBase<Eigen::Matrix<double,_696,_1,_0,_696,_1>_>.
                   m_storage.m_data.array[0x24c];
      local_3f00.super_PlainObjectBase<Eigen::Matrix<double,_5,_24,_1,_5,_24>_>.m_storage.m_data.
      array[0xd] = local_3a40.super_PlainObjectBase<Eigen::Matrix<double,_696,_1,_0,_696,_1>_>.
                   m_storage.m_data.array[0x24d];
      local_3f00.super_PlainObjectBase<Eigen::Matrix<double,_5,_24,_1,_5,_24>_>.m_storage.m_data.
      array[0xe] = local_3a40.super_PlainObjectBase<Eigen::Matrix<double,_696,_1,_0,_696,_1>_>.
                   m_storage.m_data.array[0x24e];
      local_3f00.super_PlainObjectBase<Eigen::Matrix<double,_5,_24,_1,_5,_24>_>.m_storage.m_data.
      array[0xf] = local_3a40.super_PlainObjectBase<Eigen::Matrix<double,_696,_1,_0,_696,_1>_>.
                   m_storage.m_data.array[0x24f];
      local_3f00.super_PlainObjectBase<Eigen::Matrix<double,_5,_24,_1,_5,_24>_>.m_storage.m_data.
      array[0x10] = local_3a40.super_PlainObjectBase<Eigen::Matrix<double,_696,_1,_0,_696,_1>_>.
                    m_storage.m_data.array[0x250];
      local_3f00.super_PlainObjectBase<Eigen::Matrix<double,_5,_24,_1,_5,_24>_>.m_storage.m_data.
      array[0x11] = local_3a40.super_PlainObjectBase<Eigen::Matrix<double,_696,_1,_0,_696,_1>_>.
                    m_storage.m_data.array[0x251];
      local_3f00.super_PlainObjectBase<Eigen::Matrix<double,_5,_24,_1,_5,_24>_>.m_storage.m_data.
      array[0x12] = local_3a40.super_PlainObjectBase<Eigen::Matrix<double,_696,_1,_0,_696,_1>_>.
                    m_storage.m_data.array[0x252];
      local_3f00.super_PlainObjectBase<Eigen::Matrix<double,_5,_24,_1,_5,_24>_>.m_storage.m_data.
      array[0x13] = local_3a40.super_PlainObjectBase<Eigen::Matrix<double,_696,_1,_0,_696,_1>_>.
                    m_storage.m_data.array[0x253];
      local_3f00.super_PlainObjectBase<Eigen::Matrix<double,_5,_24,_1,_5,_24>_>.m_storage.m_data.
      array[0x14] = local_3a40.super_PlainObjectBase<Eigen::Matrix<double,_696,_1,_0,_696,_1>_>.
                    m_storage.m_data.array[0x254];
      local_3f00.super_PlainObjectBase<Eigen::Matrix<double,_5,_24,_1,_5,_24>_>.m_storage.m_data.
      array[0x15] = local_3a40.super_PlainObjectBase<Eigen::Matrix<double,_696,_1,_0,_696,_1>_>.
                    m_storage.m_data.array[0x255];
      local_3f00.super_PlainObjectBase<Eigen::Matrix<double,_5,_24,_1,_5,_24>_>.m_storage.m_data.
      array[0x16] = local_3a40.super_PlainObjectBase<Eigen::Matrix<double,_696,_1,_0,_696,_1>_>.
                    m_storage.m_data.array[0x256];
      local_3f00.super_PlainObjectBase<Eigen::Matrix<double,_5,_24,_1,_5,_24>_>.m_storage.m_data.
      array[0x17] = local_3a40.super_PlainObjectBase<Eigen::Matrix<double,_696,_1,_0,_696,_1>_>.
                    m_storage.m_data.array[599];
      local_3f00.super_PlainObjectBase<Eigen::Matrix<double,_5,_24,_1,_5,_24>_>.m_storage.m_data.
      array[0x18] = local_3a40.super_PlainObjectBase<Eigen::Matrix<double,_696,_1,_0,_696,_1>_>.
                    m_storage.m_data.array[600];
      local_3f00.super_PlainObjectBase<Eigen::Matrix<double,_5,_24,_1,_5,_24>_>.m_storage.m_data.
      array[0x19] = local_3a40.super_PlainObjectBase<Eigen::Matrix<double,_696,_1,_0,_696,_1>_>.
                    m_storage.m_data.array[0x259];
      local_3f00.super_PlainObjectBase<Eigen::Matrix<double,_5,_24,_1,_5,_24>_>.m_storage.m_data.
      array[0x1a] = local_3a40.super_PlainObjectBase<Eigen::Matrix<double,_696,_1,_0,_696,_1>_>.
                    m_storage.m_data.array[0x25a];
      local_3f00.super_PlainObjectBase<Eigen::Matrix<double,_5,_24,_1,_5,_24>_>.m_storage.m_data.
      array[0x1b] = local_3a40.super_PlainObjectBase<Eigen::Matrix<double,_696,_1,_0,_696,_1>_>.
                    m_storage.m_data.array[0x25b];
      local_3f00.super_PlainObjectBase<Eigen::Matrix<double,_5,_24,_1,_5,_24>_>.m_storage.m_data.
      array[0x1c] = local_3a40.super_PlainObjectBase<Eigen::Matrix<double,_696,_1,_0,_696,_1>_>.
                    m_storage.m_data.array[0x25c];
      local_3f00.super_PlainObjectBase<Eigen::Matrix<double,_5,_24,_1,_5,_24>_>.m_storage.m_data.
      array[0x1d] = local_3a40.super_PlainObjectBase<Eigen::Matrix<double,_696,_1,_0,_696,_1>_>.
                    m_storage.m_data.array[0x25d];
      local_3f00.super_PlainObjectBase<Eigen::Matrix<double,_5,_24,_1,_5,_24>_>.m_storage.m_data.
      array[0x1e] = local_3a40.super_PlainObjectBase<Eigen::Matrix<double,_696,_1,_0,_696,_1>_>.
                    m_storage.m_data.array[0x25e];
      local_3f00.super_PlainObjectBase<Eigen::Matrix<double,_5,_24,_1,_5,_24>_>.m_storage.m_data.
      array[0x1f] = local_3a40.super_PlainObjectBase<Eigen::Matrix<double,_696,_1,_0,_696,_1>_>.
                    m_storage.m_data.array[0x25f];
      local_3f00.super_PlainObjectBase<Eigen::Matrix<double,_5,_24,_1,_5,_24>_>.m_storage.m_data.
      array[0x20] = local_3a40.super_PlainObjectBase<Eigen::Matrix<double,_696,_1,_0,_696,_1>_>.
                    m_storage.m_data.array[0x260];
      local_3f00.super_PlainObjectBase<Eigen::Matrix<double,_5,_24,_1,_5,_24>_>.m_storage.m_data.
      array[0x21] = local_3a40.super_PlainObjectBase<Eigen::Matrix<double,_696,_1,_0,_696,_1>_>.
                    m_storage.m_data.array[0x261];
      local_3f00.super_PlainObjectBase<Eigen::Matrix<double,_5,_24,_1,_5,_24>_>.m_storage.m_data.
      array[0x22] = local_3a40.super_PlainObjectBase<Eigen::Matrix<double,_696,_1,_0,_696,_1>_>.
                    m_storage.m_data.array[0x262];
      local_3f00.super_PlainObjectBase<Eigen::Matrix<double,_5,_24,_1,_5,_24>_>.m_storage.m_data.
      array[0x23] = local_3a40.super_PlainObjectBase<Eigen::Matrix<double,_696,_1,_0,_696,_1>_>.
                    m_storage.m_data.array[0x263];
      local_3f00.super_PlainObjectBase<Eigen::Matrix<double,_5,_24,_1,_5,_24>_>.m_storage.m_data.
      array[0x24] = local_3a40.super_PlainObjectBase<Eigen::Matrix<double,_696,_1,_0,_696,_1>_>.
                    m_storage.m_data.array[0x264];
      local_3f00.super_PlainObjectBase<Eigen::Matrix<double,_5,_24,_1,_5,_24>_>.m_storage.m_data.
      array[0x25] = local_3a40.super_PlainObjectBase<Eigen::Matrix<double,_696,_1,_0,_696,_1>_>.
                    m_storage.m_data.array[0x265];
      local_3f00.super_PlainObjectBase<Eigen::Matrix<double,_5,_24,_1,_5,_24>_>.m_storage.m_data.
      array[0x26] = local_3a40.super_PlainObjectBase<Eigen::Matrix<double,_696,_1,_0,_696,_1>_>.
                    m_storage.m_data.array[0x266];
      local_3f00.super_PlainObjectBase<Eigen::Matrix<double,_5,_24,_1,_5,_24>_>.m_storage.m_data.
      array[0x27] = local_3a40.super_PlainObjectBase<Eigen::Matrix<double,_696,_1,_0,_696,_1>_>.
                    m_storage.m_data.array[0x267];
      local_3f00.super_PlainObjectBase<Eigen::Matrix<double,_5,_24,_1,_5,_24>_>.m_storage.m_data.
      array[0x28] = local_3a40.super_PlainObjectBase<Eigen::Matrix<double,_696,_1,_0,_696,_1>_>.
                    m_storage.m_data.array[0x268];
      local_3f00.super_PlainObjectBase<Eigen::Matrix<double,_5,_24,_1,_5,_24>_>.m_storage.m_data.
      array[0x29] = local_3a40.super_PlainObjectBase<Eigen::Matrix<double,_696,_1,_0,_696,_1>_>.
                    m_storage.m_data.array[0x269];
      local_3f00.super_PlainObjectBase<Eigen::Matrix<double,_5,_24,_1,_5,_24>_>.m_storage.m_data.
      array[0x2a] = local_3a40.super_PlainObjectBase<Eigen::Matrix<double,_696,_1,_0,_696,_1>_>.
                    m_storage.m_data.array[0x26a];
      local_3f00.super_PlainObjectBase<Eigen::Matrix<double,_5,_24,_1,_5,_24>_>.m_storage.m_data.
      array[0x2b] = local_3a40.super_PlainObjectBase<Eigen::Matrix<double,_696,_1,_0,_696,_1>_>.
                    m_storage.m_data.array[0x26b];
      local_3f00.super_PlainObjectBase<Eigen::Matrix<double,_5,_24,_1,_5,_24>_>.m_storage.m_data.
      array[0x2c] = local_3a40.super_PlainObjectBase<Eigen::Matrix<double,_696,_1,_0,_696,_1>_>.
                    m_storage.m_data.array[0x26c];
      local_3f00.super_PlainObjectBase<Eigen::Matrix<double,_5,_24,_1,_5,_24>_>.m_storage.m_data.
      array[0x2d] = local_3a40.super_PlainObjectBase<Eigen::Matrix<double,_696,_1,_0,_696,_1>_>.
                    m_storage.m_data.array[0x26d];
      local_3f00.super_PlainObjectBase<Eigen::Matrix<double,_5,_24,_1,_5,_24>_>.m_storage.m_data.
      array[0x2e] = local_3a40.super_PlainObjectBase<Eigen::Matrix<double,_696,_1,_0,_696,_1>_>.
                    m_storage.m_data.array[0x26e];
      local_3f00.super_PlainObjectBase<Eigen::Matrix<double,_5,_24,_1,_5,_24>_>.m_storage.m_data.
      array[0x2f] = local_3a40.super_PlainObjectBase<Eigen::Matrix<double,_696,_1,_0,_696,_1>_>.
                    m_storage.m_data.array[0x26f];
      local_3f00.super_PlainObjectBase<Eigen::Matrix<double,_5,_24,_1,_5,_24>_>.m_storage.m_data.
      array[0x30] = local_3a40.super_PlainObjectBase<Eigen::Matrix<double,_696,_1,_0,_696,_1>_>.
                    m_storage.m_data.array[0x270];
      local_3f00.super_PlainObjectBase<Eigen::Matrix<double,_5,_24,_1,_5,_24>_>.m_storage.m_data.
      array[0x31] = local_3a40.super_PlainObjectBase<Eigen::Matrix<double,_696,_1,_0,_696,_1>_>.
                    m_storage.m_data.array[0x271];
      local_3f00.super_PlainObjectBase<Eigen::Matrix<double,_5,_24,_1,_5,_24>_>.m_storage.m_data.
      array[0x32] = local_3a40.super_PlainObjectBase<Eigen::Matrix<double,_696,_1,_0,_696,_1>_>.
                    m_storage.m_data.array[0x272];
      local_3f00.super_PlainObjectBase<Eigen::Matrix<double,_5,_24,_1,_5,_24>_>.m_storage.m_data.
      array[0x33] = local_3a40.super_PlainObjectBase<Eigen::Matrix<double,_696,_1,_0,_696,_1>_>.
                    m_storage.m_data.array[0x273];
      local_3f00.super_PlainObjectBase<Eigen::Matrix<double,_5,_24,_1,_5,_24>_>.m_storage.m_data.
      array[0x34] = local_3a40.super_PlainObjectBase<Eigen::Matrix<double,_696,_1,_0,_696,_1>_>.
                    m_storage.m_data.array[0x274];
      local_3f00.super_PlainObjectBase<Eigen::Matrix<double,_5,_24,_1,_5,_24>_>.m_storage.m_data.
      array[0x35] = local_3a40.super_PlainObjectBase<Eigen::Matrix<double,_696,_1,_0,_696,_1>_>.
                    m_storage.m_data.array[0x275];
      local_3f00.super_PlainObjectBase<Eigen::Matrix<double,_5,_24,_1,_5,_24>_>.m_storage.m_data.
      array[0x36] = local_3a40.super_PlainObjectBase<Eigen::Matrix<double,_696,_1,_0,_696,_1>_>.
                    m_storage.m_data.array[0x276];
      local_3f00.super_PlainObjectBase<Eigen::Matrix<double,_5,_24,_1,_5,_24>_>.m_storage.m_data.
      array[0x37] = local_3a40.super_PlainObjectBase<Eigen::Matrix<double,_696,_1,_0,_696,_1>_>.
                    m_storage.m_data.array[0x277];
      local_3f00.super_PlainObjectBase<Eigen::Matrix<double,_5,_24,_1,_5,_24>_>.m_storage.m_data.
      array[0x38] = local_3a40.super_PlainObjectBase<Eigen::Matrix<double,_696,_1,_0,_696,_1>_>.
                    m_storage.m_data.array[0x278];
      local_3f00.super_PlainObjectBase<Eigen::Matrix<double,_5,_24,_1,_5,_24>_>.m_storage.m_data.
      array[0x39] = local_3a40.super_PlainObjectBase<Eigen::Matrix<double,_696,_1,_0,_696,_1>_>.
                    m_storage.m_data.array[0x279];
      local_3f00.super_PlainObjectBase<Eigen::Matrix<double,_5,_24,_1,_5,_24>_>.m_storage.m_data.
      array[0x3a] = local_3a40.super_PlainObjectBase<Eigen::Matrix<double,_696,_1,_0,_696,_1>_>.
                    m_storage.m_data.array[0x27a];
      local_3f00.super_PlainObjectBase<Eigen::Matrix<double,_5,_24,_1,_5,_24>_>.m_storage.m_data.
      array[0x3b] = local_3a40.super_PlainObjectBase<Eigen::Matrix<double,_696,_1,_0,_696,_1>_>.
                    m_storage.m_data.array[0x27b];
      local_3f00.super_PlainObjectBase<Eigen::Matrix<double,_5,_24,_1,_5,_24>_>.m_storage.m_data.
      array[0x3c] = local_3a40.super_PlainObjectBase<Eigen::Matrix<double,_696,_1,_0,_696,_1>_>.
                    m_storage.m_data.array[0x27c];
      local_3f00.super_PlainObjectBase<Eigen::Matrix<double,_5,_24,_1,_5,_24>_>.m_storage.m_data.
      array[0x3d] = local_3a40.super_PlainObjectBase<Eigen::Matrix<double,_696,_1,_0,_696,_1>_>.
                    m_storage.m_data.array[0x27d];
      local_3f00.super_PlainObjectBase<Eigen::Matrix<double,_5,_24,_1,_5,_24>_>.m_storage.m_data.
      array[0x3e] = local_3a40.super_PlainObjectBase<Eigen::Matrix<double,_696,_1,_0,_696,_1>_>.
                    m_storage.m_data.array[0x27e];
      local_3f00.super_PlainObjectBase<Eigen::Matrix<double,_5,_24,_1,_5,_24>_>.m_storage.m_data.
      array[0x3f] = local_3a40.super_PlainObjectBase<Eigen::Matrix<double,_696,_1,_0,_696,_1>_>.
                    m_storage.m_data.array[0x27f];
      local_3f00.super_PlainObjectBase<Eigen::Matrix<double,_5,_24,_1,_5,_24>_>.m_storage.m_data.
      array[0x40] = local_3a40.super_PlainObjectBase<Eigen::Matrix<double,_696,_1,_0,_696,_1>_>.
                    m_storage.m_data.array[0x280];
      local_3f00.super_PlainObjectBase<Eigen::Matrix<double,_5,_24,_1,_5,_24>_>.m_storage.m_data.
      array[0x41] = local_3a40.super_PlainObjectBase<Eigen::Matrix<double,_696,_1,_0,_696,_1>_>.
                    m_storage.m_data.array[0x281];
      local_3f00.super_PlainObjectBase<Eigen::Matrix<double,_5,_24,_1,_5,_24>_>.m_storage.m_data.
      array[0x42] = local_3a40.super_PlainObjectBase<Eigen::Matrix<double,_696,_1,_0,_696,_1>_>.
                    m_storage.m_data.array[0x282];
      local_3f00.super_PlainObjectBase<Eigen::Matrix<double,_5,_24,_1,_5,_24>_>.m_storage.m_data.
      array[0x43] = local_3a40.super_PlainObjectBase<Eigen::Matrix<double,_696,_1,_0,_696,_1>_>.
                    m_storage.m_data.array[0x283];
      local_3f00.super_PlainObjectBase<Eigen::Matrix<double,_5,_24,_1,_5,_24>_>.m_storage.m_data.
      array[0x44] = local_3a40.super_PlainObjectBase<Eigen::Matrix<double,_696,_1,_0,_696,_1>_>.
                    m_storage.m_data.array[0x284];
      local_3f00.super_PlainObjectBase<Eigen::Matrix<double,_5,_24,_1,_5,_24>_>.m_storage.m_data.
      array[0x45] = local_3a40.super_PlainObjectBase<Eigen::Matrix<double,_696,_1,_0,_696,_1>_>.
                    m_storage.m_data.array[0x285];
      local_3f00.super_PlainObjectBase<Eigen::Matrix<double,_5,_24,_1,_5,_24>_>.m_storage.m_data.
      array[0x46] = local_3a40.super_PlainObjectBase<Eigen::Matrix<double,_696,_1,_0,_696,_1>_>.
                    m_storage.m_data.array[0x286];
      local_3f00.super_PlainObjectBase<Eigen::Matrix<double,_5,_24,_1,_5,_24>_>.m_storage.m_data.
      array[0x47] = local_3a40.super_PlainObjectBase<Eigen::Matrix<double,_696,_1,_0,_696,_1>_>.
                    m_storage.m_data.array[0x287];
      local_3f00.super_PlainObjectBase<Eigen::Matrix<double,_5,_24,_1,_5,_24>_>.m_storage.m_data.
      array[0x48] = local_3a40.super_PlainObjectBase<Eigen::Matrix<double,_696,_1,_0,_696,_1>_>.
                    m_storage.m_data.array[0x288];
      local_3f00.super_PlainObjectBase<Eigen::Matrix<double,_5,_24,_1,_5,_24>_>.m_storage.m_data.
      array[0x49] = local_3a40.super_PlainObjectBase<Eigen::Matrix<double,_696,_1,_0,_696,_1>_>.
                    m_storage.m_data.array[0x289];
      local_3f00.super_PlainObjectBase<Eigen::Matrix<double,_5,_24,_1,_5,_24>_>.m_storage.m_data.
      array[0x4a] = local_3a40.super_PlainObjectBase<Eigen::Matrix<double,_696,_1,_0,_696,_1>_>.
                    m_storage.m_data.array[0x28a];
      local_3f00.super_PlainObjectBase<Eigen::Matrix<double,_5,_24,_1,_5,_24>_>.m_storage.m_data.
      array[0x4b] = local_3a40.super_PlainObjectBase<Eigen::Matrix<double,_696,_1,_0,_696,_1>_>.
                    m_storage.m_data.array[0x28b];
      local_3f00.super_PlainObjectBase<Eigen::Matrix<double,_5,_24,_1,_5,_24>_>.m_storage.m_data.
      array[0x4c] = local_3a40.super_PlainObjectBase<Eigen::Matrix<double,_696,_1,_0,_696,_1>_>.
                    m_storage.m_data.array[0x28c];
      local_3f00.super_PlainObjectBase<Eigen::Matrix<double,_5,_24,_1,_5,_24>_>.m_storage.m_data.
      array[0x4d] = local_3a40.super_PlainObjectBase<Eigen::Matrix<double,_696,_1,_0,_696,_1>_>.
                    m_storage.m_data.array[0x28d];
      local_3f00.super_PlainObjectBase<Eigen::Matrix<double,_5,_24,_1,_5,_24>_>.m_storage.m_data.
      array[0x4e] = local_3a40.super_PlainObjectBase<Eigen::Matrix<double,_696,_1,_0,_696,_1>_>.
                    m_storage.m_data.array[0x28e];
      local_3f00.super_PlainObjectBase<Eigen::Matrix<double,_5,_24,_1,_5,_24>_>.m_storage.m_data.
      array[0x4f] = local_3a40.super_PlainObjectBase<Eigen::Matrix<double,_696,_1,_0,_696,_1>_>.
                    m_storage.m_data.array[0x28f];
      local_3f00.super_PlainObjectBase<Eigen::Matrix<double,_5,_24,_1,_5,_24>_>.m_storage.m_data.
      array[0x50] = local_3a40.super_PlainObjectBase<Eigen::Matrix<double,_696,_1,_0,_696,_1>_>.
                    m_storage.m_data.array[0x290];
      local_3f00.super_PlainObjectBase<Eigen::Matrix<double,_5,_24,_1,_5,_24>_>.m_storage.m_data.
      array[0x51] = local_3a40.super_PlainObjectBase<Eigen::Matrix<double,_696,_1,_0,_696,_1>_>.
                    m_storage.m_data.array[0x291];
      local_3f00.super_PlainObjectBase<Eigen::Matrix<double,_5,_24,_1,_5,_24>_>.m_storage.m_data.
      array[0x52] = local_3a40.super_PlainObjectBase<Eigen::Matrix<double,_696,_1,_0,_696,_1>_>.
                    m_storage.m_data.array[0x292];
      local_3f00.super_PlainObjectBase<Eigen::Matrix<double,_5,_24,_1,_5,_24>_>.m_storage.m_data.
      array[0x53] = local_3a40.super_PlainObjectBase<Eigen::Matrix<double,_696,_1,_0,_696,_1>_>.
                    m_storage.m_data.array[0x293];
      local_3f00.super_PlainObjectBase<Eigen::Matrix<double,_5,_24,_1,_5,_24>_>.m_storage.m_data.
      array[0x54] = local_3a40.super_PlainObjectBase<Eigen::Matrix<double,_696,_1,_0,_696,_1>_>.
                    m_storage.m_data.array[0x294];
      local_3f00.super_PlainObjectBase<Eigen::Matrix<double,_5,_24,_1,_5,_24>_>.m_storage.m_data.
      array[0x55] = local_3a40.super_PlainObjectBase<Eigen::Matrix<double,_696,_1,_0,_696,_1>_>.
                    m_storage.m_data.array[0x295];
      local_3f00.super_PlainObjectBase<Eigen::Matrix<double,_5,_24,_1,_5,_24>_>.m_storage.m_data.
      array[0x56] = local_3a40.super_PlainObjectBase<Eigen::Matrix<double,_696,_1,_0,_696,_1>_>.
                    m_storage.m_data.array[0x296];
      local_3f00.super_PlainObjectBase<Eigen::Matrix<double,_5,_24,_1,_5,_24>_>.m_storage.m_data.
      array[0x57] = local_3a40.super_PlainObjectBase<Eigen::Matrix<double,_696,_1,_0,_696,_1>_>.
                    m_storage.m_data.array[0x297];
      local_3f00.super_PlainObjectBase<Eigen::Matrix<double,_5,_24,_1,_5,_24>_>.m_storage.m_data.
      array[0x58] = local_3a40.super_PlainObjectBase<Eigen::Matrix<double,_696,_1,_0,_696,_1>_>.
                    m_storage.m_data.array[0x298];
      local_3f00.super_PlainObjectBase<Eigen::Matrix<double,_5,_24,_1,_5,_24>_>.m_storage.m_data.
      array[0x59] = local_3a40.super_PlainObjectBase<Eigen::Matrix<double,_696,_1,_0,_696,_1>_>.
                    m_storage.m_data.array[0x299];
      local_3f00.super_PlainObjectBase<Eigen::Matrix<double,_5,_24,_1,_5,_24>_>.m_storage.m_data.
      array[0x5a] = local_3a40.super_PlainObjectBase<Eigen::Matrix<double,_696,_1,_0,_696,_1>_>.
                    m_storage.m_data.array[0x29a];
      local_3f00.super_PlainObjectBase<Eigen::Matrix<double,_5,_24,_1,_5,_24>_>.m_storage.m_data.
      array[0x5b] = local_3a40.super_PlainObjectBase<Eigen::Matrix<double,_696,_1,_0,_696,_1>_>.
                    m_storage.m_data.array[0x29b];
      local_3f00.super_PlainObjectBase<Eigen::Matrix<double,_5,_24,_1,_5,_24>_>.m_storage.m_data.
      array[0x5c] = local_3a40.super_PlainObjectBase<Eigen::Matrix<double,_696,_1,_0,_696,_1>_>.
                    m_storage.m_data.array[0x29c];
      local_3f00.super_PlainObjectBase<Eigen::Matrix<double,_5,_24,_1,_5,_24>_>.m_storage.m_data.
      array[0x5d] = local_3a40.super_PlainObjectBase<Eigen::Matrix<double,_696,_1,_0,_696,_1>_>.
                    m_storage.m_data.array[0x29d];
      local_3f00.super_PlainObjectBase<Eigen::Matrix<double,_5,_24,_1,_5,_24>_>.m_storage.m_data.
      array[0x5e] = local_3a40.super_PlainObjectBase<Eigen::Matrix<double,_696,_1,_0,_696,_1>_>.
                    m_storage.m_data.array[0x29e];
      local_3f00.super_PlainObjectBase<Eigen::Matrix<double,_5,_24,_1,_5,_24>_>.m_storage.m_data.
      array[0x5f] = local_3a40.super_PlainObjectBase<Eigen::Matrix<double,_696,_1,_0,_696,_1>_>.
                    m_storage.m_data.array[0x29f];
      local_3f00.super_PlainObjectBase<Eigen::Matrix<double,_5,_24,_1,_5,_24>_>.m_storage.m_data.
      array[0x60] = local_3a40.super_PlainObjectBase<Eigen::Matrix<double,_696,_1,_0,_696,_1>_>.
                    m_storage.m_data.array[0x2a0];
      local_3f00.super_PlainObjectBase<Eigen::Matrix<double,_5,_24,_1,_5,_24>_>.m_storage.m_data.
      array[0x61] = local_3a40.super_PlainObjectBase<Eigen::Matrix<double,_696,_1,_0,_696,_1>_>.
                    m_storage.m_data.array[0x2a1];
      local_3f00.super_PlainObjectBase<Eigen::Matrix<double,_5,_24,_1,_5,_24>_>.m_storage.m_data.
      array[0x62] = local_3a40.super_PlainObjectBase<Eigen::Matrix<double,_696,_1,_0,_696,_1>_>.
                    m_storage.m_data.array[0x2a2];
      local_3f00.super_PlainObjectBase<Eigen::Matrix<double,_5,_24,_1,_5,_24>_>.m_storage.m_data.
      array[99] = local_3a40.super_PlainObjectBase<Eigen::Matrix<double,_696,_1,_0,_696,_1>_>.
                  m_storage.m_data.array[0x2a3];
      local_3f00.super_PlainObjectBase<Eigen::Matrix<double,_5,_24,_1,_5,_24>_>.m_storage.m_data.
      array[100] = local_3a40.super_PlainObjectBase<Eigen::Matrix<double,_696,_1,_0,_696,_1>_>.
                   m_storage.m_data.array[0x2a4];
      local_3f00.super_PlainObjectBase<Eigen::Matrix<double,_5,_24,_1,_5,_24>_>.m_storage.m_data.
      array[0x65] = local_3a40.super_PlainObjectBase<Eigen::Matrix<double,_696,_1,_0,_696,_1>_>.
                    m_storage.m_data.array[0x2a5];
      local_3f00.super_PlainObjectBase<Eigen::Matrix<double,_5,_24,_1,_5,_24>_>.m_storage.m_data.
      array[0x66] = local_3a40.super_PlainObjectBase<Eigen::Matrix<double,_696,_1,_0,_696,_1>_>.
                    m_storage.m_data.array[0x2a6];
      local_3f00.super_PlainObjectBase<Eigen::Matrix<double,_5,_24,_1,_5,_24>_>.m_storage.m_data.
      array[0x67] = local_3a40.super_PlainObjectBase<Eigen::Matrix<double,_696,_1,_0,_696,_1>_>.
                    m_storage.m_data.array[0x2a7];
      local_3f00.super_PlainObjectBase<Eigen::Matrix<double,_5,_24,_1,_5,_24>_>.m_storage.m_data.
      array[0x68] = local_3a40.super_PlainObjectBase<Eigen::Matrix<double,_696,_1,_0,_696,_1>_>.
                    m_storage.m_data.array[0x2a8];
      local_3f00.super_PlainObjectBase<Eigen::Matrix<double,_5,_24,_1,_5,_24>_>.m_storage.m_data.
      array[0x69] = local_3a40.super_PlainObjectBase<Eigen::Matrix<double,_696,_1,_0,_696,_1>_>.
                    m_storage.m_data.array[0x2a9];
      local_3f00.super_PlainObjectBase<Eigen::Matrix<double,_5,_24,_1,_5,_24>_>.m_storage.m_data.
      array[0x6a] = local_3a40.super_PlainObjectBase<Eigen::Matrix<double,_696,_1,_0,_696,_1>_>.
                    m_storage.m_data.array[0x2aa];
      local_3f00.super_PlainObjectBase<Eigen::Matrix<double,_5,_24,_1,_5,_24>_>.m_storage.m_data.
      array[0x6b] = local_3a40.super_PlainObjectBase<Eigen::Matrix<double,_696,_1,_0,_696,_1>_>.
                    m_storage.m_data.array[0x2ab];
      local_3f00.super_PlainObjectBase<Eigen::Matrix<double,_5,_24,_1,_5,_24>_>.m_storage.m_data.
      array[0x6c] = local_3a40.super_PlainObjectBase<Eigen::Matrix<double,_696,_1,_0,_696,_1>_>.
                    m_storage.m_data.array[0x2ac];
      local_3f00.super_PlainObjectBase<Eigen::Matrix<double,_5,_24,_1,_5,_24>_>.m_storage.m_data.
      array[0x6d] = local_3a40.super_PlainObjectBase<Eigen::Matrix<double,_696,_1,_0,_696,_1>_>.
                    m_storage.m_data.array[0x2ad];
      local_3f00.super_PlainObjectBase<Eigen::Matrix<double,_5,_24,_1,_5,_24>_>.m_storage.m_data.
      array[0x6e] = local_3a40.super_PlainObjectBase<Eigen::Matrix<double,_696,_1,_0,_696,_1>_>.
                    m_storage.m_data.array[0x2ae];
      local_3f00.super_PlainObjectBase<Eigen::Matrix<double,_5,_24,_1,_5,_24>_>.m_storage.m_data.
      array[0x6f] = local_3a40.super_PlainObjectBase<Eigen::Matrix<double,_696,_1,_0,_696,_1>_>.
                    m_storage.m_data.array[0x2af];
      local_3f00.super_PlainObjectBase<Eigen::Matrix<double,_5,_24,_1,_5,_24>_>.m_storage.m_data.
      array[0x70] = local_3a40.super_PlainObjectBase<Eigen::Matrix<double,_696,_1,_0,_696,_1>_>.
                    m_storage.m_data.array[0x2b0];
      local_3f00.super_PlainObjectBase<Eigen::Matrix<double,_5,_24,_1,_5,_24>_>.m_storage.m_data.
      array[0x71] = local_3a40.super_PlainObjectBase<Eigen::Matrix<double,_696,_1,_0,_696,_1>_>.
                    m_storage.m_data.array[0x2b1];
      local_3f00.super_PlainObjectBase<Eigen::Matrix<double,_5,_24,_1,_5,_24>_>.m_storage.m_data.
      array[0x72] = local_3a40.super_PlainObjectBase<Eigen::Matrix<double,_696,_1,_0,_696,_1>_>.
                    m_storage.m_data.array[0x2b2];
      local_3f00.super_PlainObjectBase<Eigen::Matrix<double,_5,_24,_1,_5,_24>_>.m_storage.m_data.
      array[0x73] = local_3a40.super_PlainObjectBase<Eigen::Matrix<double,_696,_1,_0,_696,_1>_>.
                    m_storage.m_data.array[0x2b3];
      local_3f00.super_PlainObjectBase<Eigen::Matrix<double,_5,_24,_1,_5,_24>_>.m_storage.m_data.
      array[0x74] = local_3a40.super_PlainObjectBase<Eigen::Matrix<double,_696,_1,_0,_696,_1>_>.
                    m_storage.m_data.array[0x2b4];
      local_3f00.super_PlainObjectBase<Eigen::Matrix<double,_5,_24,_1,_5,_24>_>.m_storage.m_data.
      array[0x75] = local_3a40.super_PlainObjectBase<Eigen::Matrix<double,_696,_1,_0,_696,_1>_>.
                    m_storage.m_data.array[0x2b5];
      local_3f00.super_PlainObjectBase<Eigen::Matrix<double,_5,_24,_1,_5,_24>_>.m_storage.m_data.
      array[0x76] = local_3a40.super_PlainObjectBase<Eigen::Matrix<double,_696,_1,_0,_696,_1>_>.
                    m_storage.m_data.array[0x2b6];
      local_3f00.super_PlainObjectBase<Eigen::Matrix<double,_5,_24,_1,_5,_24>_>.m_storage.m_data.
      array[0x77] = local_3a40.super_PlainObjectBase<Eigen::Matrix<double,_696,_1,_0,_696,_1>_>.
                    m_storage.m_data.array[0x2b7];
      local_2480.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.m_storage.m_data.
      array[0] = (double)((this->m_KalphaEAS).
                          super__Vector_base<Eigen::Matrix<double,_5,_5,_1,_5,_5>,_std::allocator<Eigen::Matrix<double,_5,_5,_1,_5,_5>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + uVar27);
      Eigen::internal::
      Assignment<Eigen::Matrix<double,_5,_5,_1,_5,_5>,_Eigen::Inverse<Eigen::Matrix<double,_5,_5,_1,_5,_5>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
      ::run(&local_3b08,(SrcXprType *)&local_2480,(assign_op<double,_double> *)&local_3f48);
      local_3f48 = local_1280;
      lVar26 = 0x80;
      do {
        uVar3 = *(undefined8 *)((long)local_1280 + lVar26 + -0x78);
        uVar4 = *(undefined8 *)((long)local_1280 + lVar26 + -0x70);
        uVar5 = *(undefined8 *)((long)local_1280 + lVar26 + -0x68);
        uVar6 = *(undefined8 *)((long)local_1280 + lVar26 + -0x60);
        uVar7 = *(undefined8 *)((long)local_1280 + lVar26 + -0x58);
        uVar8 = *(undefined8 *)((long)local_1280 + lVar26 + -0x50);
        uVar9 = *(undefined8 *)((long)local_1280 + lVar26 + -0x48);
        uVar10 = *(undefined8 *)((long)local_1280 + lVar26 + -0x40);
        uVar11 = *(undefined8 *)((long)local_1280 + lVar26 + -0x38);
        uVar12 = *(undefined8 *)((long)local_1280 + lVar26 + -0x30);
        uVar13 = *(undefined8 *)((long)local_1280 + lVar26 + -0x28);
        uVar14 = *(undefined8 *)((long)local_1280 + lVar26 + -0x20);
        uVar15 = *(undefined8 *)((long)local_1280 + lVar26 + -0x18);
        uVar16 = *(undefined8 *)((long)local_1280 + lVar26 + -0x10);
        uVar17 = *(undefined8 *)((long)local_1280 + lVar26 + -8);
        uVar18 = *(undefined8 *)((long)local_1280 + lVar26);
        uVar19 = *(undefined8 *)((long)local_1280 + lVar26 + 8);
        uVar20 = *(undefined8 *)((long)local_1280 + lVar26 + 0x10);
        uVar21 = *(undefined8 *)((long)local_1280 + lVar26 + 0x18);
        uVar22 = *(undefined8 *)((long)local_1280 + lVar26 + 0x20);
        uVar23 = *(undefined8 *)((long)local_1280 + lVar26 + 0x28);
        uVar24 = *(undefined8 *)((long)local_1280 + lVar26 + 0x30);
        uVar25 = *(undefined8 *)((long)local_1280 + lVar26 + 0x38);
        *(undefined8 *)
         ((long)local_2480.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.
                m_storage.m_data.array + lVar26 + -0x80) =
             *(undefined8 *)((long)local_1280 + lVar26 + -0x80);
        *(undefined8 *)
         ((long)local_2480.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.
                m_storage.m_data.array + lVar26 + -0x78) = uVar3;
        *(undefined8 *)
         ((long)local_2480.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.
                m_storage.m_data.array + lVar26 + -0x70) = uVar4;
        *(undefined8 *)
         ((long)local_2480.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.
                m_storage.m_data.array + lVar26 + -0x68) = uVar5;
        *(undefined8 *)
         ((long)local_2480.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.
                m_storage.m_data.array + lVar26 + -0x60) = uVar6;
        *(undefined8 *)
         ((long)local_2480.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.
                m_storage.m_data.array + lVar26 + -0x58) = uVar7;
        *(undefined8 *)
         ((long)local_2480.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.
                m_storage.m_data.array + lVar26 + -0x50) = uVar8;
        *(undefined8 *)
         ((long)local_2480.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.
                m_storage.m_data.array + lVar26 + -0x48) = uVar9;
        *(undefined8 *)
         ((long)local_2480.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.
                m_storage.m_data.array + lVar26 + -0x40) = uVar10;
        *(undefined8 *)
         ((long)local_2480.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.
                m_storage.m_data.array + lVar26 + -0x38) = uVar11;
        *(undefined8 *)
         ((long)local_2480.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.
                m_storage.m_data.array + lVar26 + -0x30) = uVar12;
        *(undefined8 *)
         ((long)local_2480.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.
                m_storage.m_data.array + lVar26 + -0x28) = uVar13;
        *(undefined8 *)
         ((long)local_2480.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.
                m_storage.m_data.array + lVar26 + -0x20) = uVar14;
        *(undefined8 *)
         ((long)local_2480.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.
                m_storage.m_data.array + lVar26 + -0x18) = uVar15;
        *(undefined8 *)
         ((long)local_2480.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.
                m_storage.m_data.array + lVar26 + -0x10) = uVar16;
        *(undefined8 *)
         ((long)local_2480.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.
                m_storage.m_data.array + lVar26 + -8) = uVar17;
        *(undefined8 *)
         ((long)local_2480.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.
                m_storage.m_data.array + lVar26) = uVar18;
        *(undefined8 *)
         ((long)local_2480.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.
                m_storage.m_data.array + lVar26 + 8) = uVar19;
        *(undefined8 *)
         ((long)local_2480.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.
                m_storage.m_data.array + lVar26 + 0x10) = uVar20;
        *(undefined8 *)
         ((long)local_2480.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.
                m_storage.m_data.array + lVar26 + 0x18) = uVar21;
        *(undefined8 *)
         ((long)local_2480.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.
                m_storage.m_data.array + lVar26 + 0x20) = uVar22;
        *(undefined8 *)
         ((long)local_2480.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.
                m_storage.m_data.array + lVar26 + 0x28) = uVar23;
        *(undefined8 *)
         ((long)local_2480.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.
                m_storage.m_data.array + lVar26 + 0x30) = uVar24;
        *(undefined8 *)
         ((long)local_2480.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.
                m_storage.m_data.array + lVar26 + 0x38) = uVar25;
        lVar26 = lVar26 + 0xc0;
      } while (lVar26 != 0x1280);
      local_3f78 = -1.0;
      local_3f40.m_lhs.m_lhs.m_functor.m_other = Kfactor;
      local_3f40.m_lhs.m_rhs.m_matrix = &local_3f00;
      local_3f40.m_rhs = &local_3b08;
      local_3f10 = &local_3f00;
      Eigen::internal::
      generic_product_impl<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,24,5,0,24,5>const>const,Eigen::Transpose<Eigen::Matrix<double,5,24,1,5,24>>const>,Eigen::Matrix<double,5,5,1,5,5>,0>,Eigen::Matrix<double,5,24,1,5,24>,Eigen::DenseShape,Eigen::DenseShape,8>
      ::scaleAndAddTo<Eigen::Matrix<double,24,24,1,24,24>>
                (&local_2480,&local_3f40,&local_3f00,&local_3f78);
      lVar26 = 0;
      do {
        auVar28 = vaddpd_avx512f(*(undefined1 (*) [64])
                                  ((long)local_2480.
                                         super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>
                                         .m_storage.m_data.array + lVar26),
                                 *(undefined1 (*) [64])
                                  ((long)(this->m_JacobianMatrix).
                                         super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>
                                         .m_storage.m_data.array + lVar26));
        *(undefined1 (*) [64])
         ((long)(this->m_JacobianMatrix).
                super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.m_storage.m_data.
                array + lVar26) = auVar28;
        auVar28 = vaddpd_avx512f(*(undefined1 (*) [64])
                                  ((long)local_2480.
                                         super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>
                                         .m_storage.m_data.array + lVar26 + 0x40),
                                 *(undefined1 (*) [64])
                                  ((long)(this->m_JacobianMatrix).
                                         super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>
                                         .m_storage.m_data.array + lVar26 + 0x40));
        *(undefined1 (*) [64])
         ((long)(this->m_JacobianMatrix).
                super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.m_storage.m_data.
                array + lVar26 + 0x40) = auVar28;
        auVar28 = vaddpd_avx512f(*(undefined1 (*) [64])
                                  ((long)local_2480.
                                         super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>
                                         .m_storage.m_data.array + lVar26 + 0x80),
                                 *(undefined1 (*) [64])
                                  ((long)(this->m_JacobianMatrix).
                                         super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>
                                         .m_storage.m_data.array + lVar26 + 0x80));
        *(undefined1 (*) [64])
         ((long)(this->m_JacobianMatrix).
                super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.m_storage.m_data.
                array + lVar26 + 0x80) = auVar28;
        lVar26 = lVar26 + 0xc0;
      } while (lVar26 != 0x1200);
      uVar27 = uVar1;
    } while (uVar1 < this->m_numLayers);
  }
  return;
}

Assistant:

void ChElementShellANCF_3423::ComputeInternalJacobians(double Kfactor, double Rfactor) {
    // Note that the matrices with current nodal coordinates and velocities are
    // already available in m_d and m_d_dt (as set in ComputeInternalForces).
    // Similarly, the ANS strain and strain derivatives are already available in
    // m_strainANS and m_strainANS_D (as calculated in ComputeInternalForces).

    m_JacobianMatrix.setZero();

    // Loop over all layers.
    for (size_t kl = 0; kl < m_numLayers; kl++) {
        ShellANCF_Jacobian formula(this, Kfactor, Rfactor, kl);
        ChVectorN<double, 696> result;
        result.setZero();
        ChQuadrature::Integrate3D<ChVectorN<double, 696>>(result,                          // result of integration
                                                          formula,                         // integrand formula
                                                          -1, 1,                           // x limits
                                                          -1, 1,                           // y limits
                                                          m_GaussZ[kl], m_GaussZ[kl + 1],  // z limits
                                                          2                                // order of integration
        );

        // Extract matrices from result of integration
        ChMatrixNM<double, 24, 24> KTE;
        ChMatrixNM<double, 5, 24> GDEPSP;
        KTE = Eigen::Map<ChMatrixNM<double, 24, 24>>(result.segment(0, 24 * 24).data(), 24, 24);
        GDEPSP = Eigen::Map<ChMatrixNM<double, 5, 24>>(result.segment(576, 5 * 24).data(), 5, 24);

        // Include EAS contribution to the stiffness component (hence scaled by Kfactor)
        // EAS = GDEPSP' * KalphaEAS_inv * GDEPSP
        ChMatrixNM<double, 5, 5> KalphaEAS_inv = m_KalphaEAS[kl].inverse();
        m_JacobianMatrix += KTE - Kfactor * GDEPSP.transpose() * KalphaEAS_inv * GDEPSP;
    }
}